

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleImageTests.cpp
# Opt level: O3

Move<vk::Handle<(vk::HandleType)9>_> * __thiscall
vkt::pipeline::anon_unknown_0::makeImage
          (Move<vk::Handle<(vk::HandleType)9>_> *__return_storage_ptr__,anon_unknown_0 *this,
          DeviceInterface *vk,VkDevice device,VkFormat format,IVec2 *size,deUint32 numLayers,
          VkSampleCountFlagBits samples,VkImageUsageFlags usage)

{
  Move<vk::Handle<(vk::HandleType)9>_> *pMVar1;
  VkImageCreateInfo local_70;
  
  local_70.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  local_70.pNext = (void *)0x0;
  local_70.flags = 0;
  local_70.imageType = VK_IMAGE_TYPE_2D;
  local_70.format = (VkFormat)device;
  local_70.extent._0_8_ = (ulong)format | (long)size << 0x20;
  local_70.extent.depth = 1;
  local_70.mipLevels = 1;
  local_70.arrayLayers = numLayers;
  local_70.samples = samples;
  local_70.tiling = VK_IMAGE_TILING_OPTIMAL;
  local_70.usage = usage;
  local_70.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  local_70.queueFamilyIndexCount = 0;
  local_70.pQueueFamilyIndices = (deUint32 *)0x0;
  local_70.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  pMVar1 = ::vk::createImage(__return_storage_ptr__,(DeviceInterface *)this,(VkDevice)vk,&local_70,
                             (VkAllocationCallbacks *)0x0);
  return pMVar1;
}

Assistant:

Move<VkImage> makeImage (const DeviceInterface& vk, const VkDevice device, const VkFormat format, const IVec2& size, const deUint32 numLayers, const VkSampleCountFlagBits samples, const VkImageUsageFlags usage)
{
	const VkImageCreateInfo imageParams =
	{
		VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,			// VkStructureType			sType;
		DE_NULL,										// const void*				pNext;
		(VkImageCreateFlags)0,							// VkImageCreateFlags		flags;
		VK_IMAGE_TYPE_2D,								// VkImageType				imageType;
		format,											// VkFormat					format;
		makeExtent3D(size.x(), size.y(), 1),			// VkExtent3D				extent;
		1u,												// deUint32					mipLevels;
		numLayers,										// deUint32					arrayLayers;
		samples,										// VkSampleCountFlagBits	samples;
		VK_IMAGE_TILING_OPTIMAL,						// VkImageTiling			tiling;
		usage,											// VkImageUsageFlags		usage;
		VK_SHARING_MODE_EXCLUSIVE,						// VkSharingMode			sharingMode;
		0u,												// deUint32					queueFamilyIndexCount;
		DE_NULL,										// const deUint32*			pQueueFamilyIndices;
		VK_IMAGE_LAYOUT_UNDEFINED,						// VkImageLayout			initialLayout;
	};
	return createImage(vk, device, &imageParams);
}